

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JsonLibSample.c
# Opt level: O1

int main(int ArgC,char **ArgV)

{
  char *__filename;
  uint uVar1;
  JL_STATUS JVar2;
  int iVar3;
  FILE *pFVar4;
  long lVar5;
  char *pcVar6;
  size_t sVar7;
  int iVar8;
  bool bVar9;
  uint uVar10;
  SampleConfigStruct myConfig;
  char *outputJsonString;
  size_t errorAtPos;
  JlMarshallElement marshalSampleConfigStruct [2];
  char *local_108;
  ulong uStack_100;
  char *local_f8;
  size_t local_f0;
  JlMarshallElement local_e8 [2];
  
  memcpy(local_e8,&DAT_00109d30,0xc0);
  local_108 = (char *)0x0;
  uStack_100 = 0;
  if (ArgC != 2) {
    puts("Syntax:\n  JsonLibSample <SampleJsonFile>\n");
    return 1;
  }
  __filename = ArgV[1];
  local_f0 = 0;
  pFVar4 = fopen(__filename,"rt");
  if (pFVar4 == (FILE *)0x0) {
    pcVar6 = (char *)0x0;
    bVar9 = false;
  }
  else {
    fseek(pFVar4,0,2);
    lVar5 = ftell(pFVar4);
    fseek(pFVar4,0,0);
    uVar10 = (uint)lVar5;
    if (((int)uVar10 < 1) || (pcVar6 = (char *)malloc((ulong)(uVar10 + 1)), pcVar6 == (char *)0x0))
    {
      pcVar6 = (char *)0x0;
      bVar9 = false;
    }
    else {
      sVar7 = fread(pcVar6,1,(ulong)(uVar10 & 0x7fffffff),pFVar4);
      uVar1 = (uint)sVar7;
      bVar9 = 0 < (int)uVar1 && (int)uVar1 <= (int)uVar10;
      if (0 < (int)uVar1 && (int)uVar1 <= (int)uVar10) {
        pcVar6[uVar1 & 0x7fffffff] = '\0';
        bVar9 = true;
      }
      else {
        pcVar6 = (char *)0x0;
      }
    }
    fclose(pFVar4);
  }
  if (bVar9) {
    JVar2 = JlJsonToStruct(pcVar6,local_e8,2,&local_108,&local_f0);
    if (JVar2 == JL_STATUS_SUCCESS) {
      uStack_100 = CONCAT44(uStack_100._4_4_,(int)uStack_100 + 1);
      goto LAB_00101442;
    }
    bVar9 = false;
    printf("Failed to parse json in file: %s Position: %u\n",__filename,local_f0 & 0xffffffff);
    iVar8 = 3;
  }
  else {
    local_108 = (char *)WjTestLib_Calloc(0x20,1);
    builtin_strncpy(local_108,"Example Json File",0x12);
    uStack_100 = CONCAT44(uStack_100._4_4_,1);
    bVar9 = true;
LAB_00101442:
    iVar8 = 0;
  }
  if (!bVar9) {
    return iVar8;
  }
  printf("Name: %s\nNumRuns: %u\n",local_108,uStack_100 & 0xffffffff);
  local_f8 = (char *)0x0;
  JVar2 = JlStructToJson(&local_108,local_e8,2,true,&local_f8);
  pcVar6 = local_f8;
  if (JVar2 != JL_STATUS_SUCCESS) {
    puts("Failed to generate Json");
    iVar8 = 4;
    goto LAB_001014ff;
  }
  pFVar4 = fopen(__filename,"w+t");
  if (pFVar4 == (FILE *)0x0) {
LAB_001014df:
    printf("Failed to write Json back out to file: %s\n",__filename);
    iVar8 = 5;
  }
  else {
    iVar3 = fprintf(pFVar4,"%s",pcVar6);
    fclose(pFVar4);
    if (iVar3 < 0) goto LAB_001014df;
  }
  JlFreeJsonStringBuffer(&local_f8);
LAB_001014ff:
  JlUnmarshallFreeStructAllocs(local_e8,2,&local_108);
  return iVar8;
}

Assistant:

int
main
    (
        int     ArgC,
        char**  ArgV
    )
{
    int result = 0;

    // The structure that represents the JSON file
    typedef struct
    {
        char* Name;
        uint32_t NumRuns;
    } SampleConfigStruct;

    // Mapping of JSON elements to structure elements
    JlMarshallElement marshalSampleConfigStruct[] =
    {
        JlMarshallString( SampleConfigStruct, Name, "Name" ),
        JlMarshallUnsigned( SampleConfigStruct, NumRuns, "NumRuns" ),
    };
    size_t marshalSampleConfigStructCount = sizeof(marshalSampleConfigStruct)/sizeof(marshalSampleConfigStruct[0]);

    SampleConfigStruct myConfig = {0};

    if( 2 != ArgC )
    {
        printf(
            "Syntax:\n"
            "  JsonLibSample <SampleJsonFile>\n"
            "\n" );
        result = 1;
    }
    else
    {
        char const* inputFilename = ArgV[1];
        bool success;
        char* inputJsonString = NULL;
        JL_STATUS jlStatus;
        size_t errorAtPos = 0;

        success = ReadFileIntoMemory( inputFilename, &inputJsonString );
        if( success )
        {

            // Unmarshall the JSON into the structure.
            jlStatus = JlJsonToStruct( inputJsonString, marshalSampleConfigStruct, marshalSampleConfigStructCount, &myConfig, &errorAtPos );
            if( JL_STATUS_SUCCESS == jlStatus )
            {
                // Increment the run count
                myConfig.NumRuns += 1;
            }
            else
            {
                printf( "Failed to parse json in file: %s Position: %u\n", inputFilename, (uint32_t)errorAtPos );
                result = 3;
                success = false;
            }
        }
        else
        {
            // No Json file, so create new struct
            myConfig.Name = JlAlloc( 32 );
            strcpy( myConfig.Name, "Example Json File" );
            myConfig.NumRuns = 1;
            success = true;
        }

        if( success )
        {
            // Print info
            printf( "Name: %s\nNumRuns: %u\n", myConfig.Name, myConfig.NumRuns );

            // Now generate new Json
            char* outputJsonString = NULL;
            jlStatus = JlStructToJson( &myConfig, marshalSampleConfigStruct, marshalSampleConfigStructCount, true, &outputJsonString );
            if( JL_STATUS_SUCCESS == jlStatus )
            {
                // Save json file back out
                success = SaveTextFile( inputFilename, outputJsonString );
                if( success )
                {
                    // Success
                }
                else
                {
                    printf( "Failed to write Json back out to file: %s\n", inputFilename );
                    result = 5;
                }

                JlFreeJsonStringBuffer( &outputJsonString );
            }
            else
            {
                printf( "Failed to generate Json\n" );
                result = 4;
            }

            JlUnmarshallFreeStructAllocs( marshalSampleConfigStruct, marshalSampleConfigStructCount, &myConfig );
        }
    }

    return result;
}